

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetFunctionTableName(ExpressionContext *ctx,FunctionData *function)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined4 extraout_var;
  char *name;
  uint nameLength;
  char *pos;
  FunctionData *function_local;
  ExpressionContext *ctx_local;
  
  if (function->scope->ownerType == (TypeBase *)0x0) {
    __assert_fail("function->scope->ownerType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x1b9,"InplaceStr GetFunctionTableName(ExpressionContext &, FunctionData *)");
  }
  pcVar4 = strstr((function->name->name).begin,"::");
  if (pcVar4 != (char *)0x0) {
    uVar1 = InplaceStr::length(&function->name->name);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar1 + 0x21));
    uVar3 = InplaceStr::hash(&(function->type->super_TypeBase).name);
    NULLC::SafeSprintf((char *)CONCAT44(extraout_var,iVar2),(ulong)(uVar1 + 0x21),"$vtbl%010u%s",
                       (ulong)uVar3,pcVar4 + 2);
    InplaceStr::InplaceStr((InplaceStr *)&ctx_local,(char *)CONCAT44(extraout_var,iVar2));
    return _ctx_local;
  }
  __assert_fail("pos",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x1bd,"InplaceStr GetFunctionTableName(ExpressionContext &, FunctionData *)");
}

Assistant:

InplaceStr GetFunctionTableName(ExpressionContext &ctx, FunctionData *function)
{
	assert(function->scope->ownerType);

	const char *pos = strstr(function->name->name.begin, "::");

	assert(pos);

	unsigned nameLength = function->name->name.length() + 32 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);
	NULLC::SafeSprintf(name, nameLength, "$vtbl%010u%s", function->type->name.hash(), pos + 2);

	return InplaceStr(name);
}